

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.c
# Opt level: O3

int mbedtls_md_hmac_reset(mbedtls_md_context_t *ctx)

{
  uchar *puVar1;
  int iVar2;
  
  iVar2 = -0x5100;
  if (((ctx != (mbedtls_md_context_t *)0x0) && (ctx->md_info != (mbedtls_md_info_t *)0x0)) &&
     (puVar1 = (uchar *)ctx->hmac_ctx, puVar1 != (uchar *)0x0)) {
    iVar2 = (*ctx->md_info->starts_func)(ctx->md_ctx);
    if (iVar2 == 0) {
      iVar2 = (*ctx->md_info->update_func)(ctx->md_ctx,puVar1,(long)ctx->md_info->block_size);
      return iVar2;
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_md_hmac_reset( mbedtls_md_context_t *ctx )
{
    int ret;
    unsigned char *ipad;

    if( ctx == NULL || ctx->md_info == NULL || ctx->hmac_ctx == NULL )
        return( MBEDTLS_ERR_MD_BAD_INPUT_DATA );

    ipad = (unsigned char *) ctx->hmac_ctx;

    if( ( ret = ctx->md_info->starts_func( ctx->md_ctx ) ) != 0 )
        return( ret );
    return( ctx->md_info->update_func( ctx->md_ctx, ipad,
                                       ctx->md_info->block_size ) );
}